

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

char * GetParseTreeNodeName(SynBase *syntax)

{
  switch(syntax->typeID) {
  case 0:
    return "SynError";
  default:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                  ,0xe84,"const char *GetParseTreeNodeName(SynBase *)");
  case 3:
    return "SynNothing";
  case 4:
    return "SynIdentifier";
  case 5:
    return "SynTypeAuto";
  case 6:
    return "SynTypeGeneric";
  case 7:
    return "SynTypeSimple";
  case 8:
    return "SynTypeAlias";
  case 9:
    return "SynTypeArray";
  case 10:
    return "SynTypeReference";
  case 0xb:
    return "SynTypeFunction";
  case 0xc:
    return "SynTypeGenericInstance";
  case 0xd:
    return "SynTypeof";
  case 0xe:
    return "SynBool";
  case 0xf:
    return "SynNumber";
  case 0x10:
    return "SynNullptr";
  case 0x11:
    return "SynCharacter";
  case 0x12:
    return "SynString";
  case 0x13:
    return "SynArray";
  case 0x14:
    return "SynGenerator";
  case 0x15:
    return "SynAlign";
  case 0x16:
    return "SynTypedef";
  case 0x17:
    return "SynMemberAccess";
  case 0x18:
    return "SynCallArgument";
  case 0x19:
    return "SynArrayIndex";
  case 0x1a:
    return "SynFunctionCall";
  case 0x1b:
    return "SynPreModify";
  case 0x1c:
    return "SynPostModify";
  case 0x1d:
    return "SynGetAddress";
  case 0x1e:
    return "SynDereference";
  case 0x1f:
    return "SynSizeof";
  case 0x20:
    return "SynNew";
  case 0x21:
    return "SynConditional";
  case 0x22:
    return "SynReturn";
  case 0x23:
    return "SynYield";
  case 0x24:
    return "SynBreak";
  case 0x25:
    return "SynContinue";
  case 0x26:
    return "SynBlock";
  case 0x27:
    return "SynIfElse";
  case 0x28:
    return "SynFor";
  case 0x29:
    return "SynForEachIterator";
  case 0x2a:
    return "SynForEach";
  case 0x2b:
    return "SynWhile";
  case 0x2c:
    return "SynDoWhile";
  case 0x2d:
    return "SynSwitchCase";
  case 0x2e:
    return "SynSwitch";
  case 0x2f:
    return "SynUnaryOp";
  case 0x30:
    return "SynBinaryOp";
  case 0x31:
    return "SynAssignment";
  case 0x32:
    return "SynModifyAssignment";
  case 0x33:
    return "SynVariableDefinition";
  case 0x34:
    return "SynVariableDefinitions";
  case 0x35:
    return "SynAccessor";
  case 0x36:
    return "SynFunctionArgument";
  case 0x37:
    return "SynFunctionDefinition";
  case 0x38:
    return "SynShortFunctionArgument";
  case 0x39:
    return "SynShortFunctionDefinition";
  case 0x3a:
    return "SynConstant";
  case 0x3b:
    return "SynConstantSet";
  case 0x3c:
    return "SynClassPrototype";
  case 0x3d:
    return "SynClassStaticIf";
  case 0x3e:
    return "SynClassElements";
  case 0x3f:
    return "SynClassDefinition";
  case 0x40:
    return "SynEnumDefinition";
  case 0x41:
    return "SynNamespaceDefinition";
  case 0x42:
    return "SynModuleImport";
  case 0x43:
    return "SynModule";
  }
}

Assistant:

const char* GetParseTreeNodeName(SynBase *syntax)
{
	switch(syntax->typeID)
	{
	case SynError::myTypeID:
		return "SynError";
	case SynNothing::myTypeID:
		return "SynNothing";
	case SynIdentifier::myTypeID:
		return "SynIdentifier";
	case SynTypeAuto::myTypeID:
		return "SynTypeAuto";
	case SynTypeGeneric::myTypeID:
		return "SynTypeGeneric";
	case SynTypeSimple::myTypeID:
		return "SynTypeSimple";
	case SynTypeAlias::myTypeID:
		return "SynTypeAlias";
	case SynTypeArray::myTypeID:
		return "SynTypeArray";
	case SynTypeReference::myTypeID:
		return "SynTypeReference";
	case SynTypeFunction::myTypeID:
		return "SynTypeFunction";
	case SynTypeGenericInstance::myTypeID:
		return "SynTypeGenericInstance";
	case SynTypeof::myTypeID:
		return "SynTypeof";
	case SynBool::myTypeID:
		return "SynBool";
	case SynNumber::myTypeID:
		return "SynNumber";
	case SynNullptr::myTypeID:
		return "SynNullptr";
	case SynCharacter::myTypeID:
		return "SynCharacter";
	case SynString::myTypeID:
		return "SynString";
	case SynArray::myTypeID:
		return "SynArray";
	case SynGenerator::myTypeID:
		return "SynGenerator";
	case SynAlign::myTypeID:
		return "SynAlign";
	case SynTypedef::myTypeID:
		return "SynTypedef";
	case SynMemberAccess::myTypeID:
		return "SynMemberAccess";
	case SynCallArgument::myTypeID:
		return "SynCallArgument";
	case SynArrayIndex::myTypeID:
		return "SynArrayIndex";
	case SynFunctionCall::myTypeID:
		return "SynFunctionCall";
	case SynPreModify::myTypeID:
		return "SynPreModify";
	case SynPostModify::myTypeID:
		return "SynPostModify";
	case SynGetAddress::myTypeID:
		return "SynGetAddress";
	case SynDereference::myTypeID:
		return "SynDereference";
	case SynSizeof::myTypeID:
		return "SynSizeof";
	case SynNew::myTypeID:
		return "SynNew";
	case SynConditional::myTypeID:
		return "SynConditional";
	case SynReturn::myTypeID:
		return "SynReturn";
	case SynYield::myTypeID:
		return "SynYield";
	case SynBreak::myTypeID:
		return "SynBreak";
	case SynContinue::myTypeID:
		return "SynContinue";
	case SynBlock::myTypeID:
		return "SynBlock";
	case SynIfElse::myTypeID:
		return "SynIfElse";
	case SynFor::myTypeID:
		return "SynFor";
	case SynForEachIterator::myTypeID:
		return "SynForEachIterator";
	case SynForEach::myTypeID:
		return "SynForEach";
	case SynWhile::myTypeID:
		return "SynWhile";
	case SynDoWhile::myTypeID:
		return "SynDoWhile";
	case SynSwitchCase::myTypeID:
		return "SynSwitchCase";
	case SynSwitch::myTypeID:
		return "SynSwitch";
	case SynUnaryOp::myTypeID:
		return "SynUnaryOp";
	case SynBinaryOp::myTypeID:
		return "SynBinaryOp";
	case SynAssignment::myTypeID:
		return "SynAssignment";
	case SynModifyAssignment::myTypeID:
		return "SynModifyAssignment";
	case SynVariableDefinition::myTypeID:
		return "SynVariableDefinition";
	case SynVariableDefinitions::myTypeID:
		return "SynVariableDefinitions";
	case SynAccessor::myTypeID:
		return "SynAccessor";
	case SynFunctionArgument::myTypeID:
		return "SynFunctionArgument";
	case SynFunctionDefinition::myTypeID:
		return "SynFunctionDefinition";
	case SynShortFunctionArgument::myTypeID:
		return "SynShortFunctionArgument";
	case SynShortFunctionDefinition::myTypeID:
		return "SynShortFunctionDefinition";
	case SynConstant::myTypeID:
		return "SynConstant";
	case SynConstantSet::myTypeID:
		return "SynConstantSet";
	case SynClassPrototype::myTypeID:
		return "SynClassPrototype";
	case SynClassStaticIf::myTypeID:
		return "SynClassStaticIf";
	case SynClassElements::myTypeID:
		return "SynClassElements";
	case SynClassDefinition::myTypeID:
		return "SynClassDefinition";
	case SynEnumDefinition::myTypeID:
		return "SynEnumDefinition";
	case SynNamespaceDefinition::myTypeID:
		return "SynNamespaceDefinition";
	case SynModuleImport::myTypeID:
		return "SynModuleImport";
	case SynModule::myTypeID:
		return "SynModule";
	default:
		break;
	}

	assert(!"unknown type");
	return "unknown";
}